

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O1

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::updateJacobians
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,S *x)

{
  PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_> *pPVar1;
  DenseStorage<float,_6,_2,_3,_0> *pDVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pPVar1 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>;
  (pPVar1->m_storage).m_data.array[0] = 0.0;
  (pPVar1->m_storage).m_data.array[1] = 0.0;
  pDVar2 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage;
  (pDVar2->m_data).array[2] = 0.0;
  (pDVar2->m_data).array[3] = 0.0;
  pDVar2 = &(this->
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage;
  (pDVar2->m_data).array[4] = 0.0;
  (pDVar2->m_data).array[5] = 0.0;
  fVar7 = (x->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  fVar6 = fVar7 - (this->landmark1).super_Matrix<float,_2,_1>.
                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                  [0];
  fVar8 = (x->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  fVar3 = fVar8 - (this->landmark1).super_Matrix<float,_2,_1>.
                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                  [1];
  fVar7 = fVar7 - (this->landmark2).super_Matrix<float,_2,_1>.
                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                  [0];
  fVar8 = fVar8 - (this->landmark2).super_Matrix<float,_2,_1>.
                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                  [1];
  fVar4 = fVar3 * fVar3 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = fVar8 * fVar8 + fVar7 * fVar7;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       fVar6 / fVar4;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2] =
       fVar3 / fVar4;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[1] =
       fVar7 / fVar5;
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).H.super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[3] =
       fVar8 / fVar5;
  return;
}

Assistant:

void updateJacobians( const S& x )
    {
        // H = dh/dx (Jacobian of measurement function w.r.t. the state)
        this->H.setZero();
        
        // Robot position as (x,y)-vector
        // This uses the Eigen template method to get the first 2 elements of the vector
        Kalman::Vector<T, 2> position = x.template head<2>();
        
        // Distance of robot to landmark 1
        Kalman::Vector<T, 2> delta1 = position - landmark1;
        
        // Distance of robot to landmark 2
        Kalman::Vector<T, 2> delta2 = position - landmark2;
        
        // Distances
        T d1 = std::sqrt( delta1.dot(delta1) );
        T d2 = std::sqrt( delta2.dot(delta2) );
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D1, S::X ) = delta1[0] / d1;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D1, S::Y ) = delta1[1] / d1;
        
        // partial derivative of meas.d1() w.r.t. x.x()
        this->H( M::D2, S::X ) = delta2[0] / d2;
        // partial derivative of meas.d1() w.r.t. x.y()
        this->H( M::D2, S::Y ) = delta2[1] / d2;
    }